

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O3

string * std::format<std::__cxx11::string&,std::__cxx11::string>
                   (string *__return_storage_ptr__,string_view fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1)

{
  string *psVar1;
  char *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> fragments;
  stringstream ss;
  string *local_3c0;
  size_t local_3b8;
  char *local_3b0;
  long local_3a8;
  char *local_3a0;
  long alStack_398 [60];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar5 = fmt._M_str;
  sVar9 = fmt._M_len;
  uVar7 = 0;
  local_3c0 = __return_storage_ptr__;
  memset(&local_3b8,0,0x200);
  pcVar3 = pcVar5;
  if (sVar9 != 0) {
    sVar6 = 0;
    uVar7 = 0;
    pcVar2 = pcVar5;
    do {
      pcVar3 = pcVar5 + sVar6;
      if ((pcVar5[sVar6] != '}') && (pcVar3 = pcVar2, pcVar5[sVar6] == '{')) {
        if (pcVar2 == pcVar5) {
          (&local_3b8)[uVar7 * 2] = sVar6;
          (&local_3b0)[uVar7 * 2] = pcVar5;
          pcVar3 = pcVar5;
          uVar7 = uVar7 + 1;
        }
        else if (uVar7 < 0x20 && pcVar5 + sVar6 != pcVar2) {
          (&local_3b8)[uVar7 * 2] = (size_t)(pcVar5 + ((sVar6 - 1) - (long)pcVar2));
          (&local_3b0)[uVar7 * 2] = pcVar2 + 1;
          uVar7 = uVar7 + 1;
        }
      }
      sVar6 = sVar6 + 1;
      pcVar2 = pcVar3;
    } while (sVar9 != sVar6);
  }
  pcVar3 = pcVar3 + 1;
  if (pcVar3 != pcVar5 + sVar9) {
    (&local_3b8)[uVar7 * 2] = (long)(pcVar5 + sVar9) - (long)pcVar3;
    (&local_3b0)[uVar7 * 2] = pcVar3;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,local_3b8);
  psVar1 = local_3c0;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3a0,local_3a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(ts_1->_M_dataplus)._M_p,ts_1->_M_string_length);
  for (lVar8 = 0x28; lVar8 != 0x208; lVar8 = lVar8 + 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)&local_3b8 + lVar8),*(long *)((long)&local_3c0 + lVar8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}